

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::initTest
          (TessellationShaderTessellationMaxInOut *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  TessellationShaderTessellationMaxInOut *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Tessellation shader functionality not supported, skipping",
               &local_39);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(local_18 + 0x708))(1,&this->m_vao_id);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xa3f);
  (**(code **)(local_18 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xa42);
  (**(code **)(local_18 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,2);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glPatchParameteriEXT() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xa48);
  retrieveGLConstantValues(this);
  initProgramObjects(this);
  initBufferObjects(this);
  initReferenceValues(this);
  (**(code **)(local_18 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glEnable(RASTERIZER_DISCARD) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xa51);
  return;
}

Assistant:

void TessellationShaderTessellationMaxInOut::initTest(void)
{
	/* Render state setup */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* All tessellation control shaders used by this test assume two
	 * vertices are going to be provided per input patch. */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 2);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed!");

	/* Carry on with initialization */
	retrieveGLConstantValues();
	initProgramObjects();
	initBufferObjects();
	initReferenceValues();

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(RASTERIZER_DISCARD) failed!");
}